

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMutexUnix.c
# Opt level: O2

deMutex deMutex_create(deMutexAttributes *attributes)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pthread_mutexattr_t attr;
  
  __mutex = (pthread_mutex_t *)deMalloc(0x28);
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
    if (iVar1 == 0) {
      iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,0);
      if ((iVar1 == 0) &&
         (((attributes == (deMutexAttributes *)0x0 || ((attributes->flags & 1) == 0)) ||
          (iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1), iVar1 == 0)))) {
        iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)&attr);
        pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
        if (iVar1 == 0) {
          return (deMutex)__mutex;
        }
      }
      else {
        pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
      }
    }
    deFree(__mutex);
  }
  return 0;
}

Assistant:

deMutex deMutex_create (const deMutexAttributes* attributes)
{
	pthread_mutexattr_t	attr;
	int					ret;
	pthread_mutex_t*	mutex = deMalloc(sizeof(pthread_mutex_t));

	if (!mutex)
		return 0;

	if (pthread_mutexattr_init(&attr) != 0)
	{
		deFree(mutex);
		return 0;
	}

#if defined(DE_DEBUG)
	if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ERRORCHECK) != 0)
#else
	if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_NORMAL) != 0)
#endif
	{
		pthread_mutexattr_destroy(&attr);
		deFree(mutex);
		return 0;
	}

	if (attributes)
	{
		if (attributes->flags & DE_MUTEX_RECURSIVE)
		{
			if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE) != 0)
			{
				pthread_mutexattr_destroy(&attr);
				deFree(mutex);
				return 0;
			}
		}
	}

	ret = pthread_mutex_init(mutex, &attr);
	if (ret != 0)
	{
		pthread_mutexattr_destroy(&attr);
		deFree(mutex);
		return 0;
	}

	pthread_mutexattr_destroy(&attr);

	return (deMutex)mutex;
}